

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void prepare_horizontal_filter_coeff_alpha0(int sx,__m128i *coeff)

{
  int8_t aiVar1 [8];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i alVar10;
  __m128i tmp_0;
  __m128i *coeff_local;
  int sx_local;
  
  aiVar1 = av1_filter_8bit[sx >> 10];
  auVar9._8_8_ = 0;
  auVar9[0] = aiVar1[0];
  auVar9[1] = aiVar1[1];
  auVar9[2] = aiVar1[2];
  auVar9[3] = aiVar1[3];
  auVar9[4] = aiVar1[4];
  auVar9[5] = aiVar1[5];
  auVar9[6] = aiVar1[6];
  auVar9[7] = aiVar1[7];
  auVar8[8] = '\0';
  auVar8[9] = '\x01';
  auVar8[10] = '\0';
  auVar8[0xb] = '\x01';
  auVar8[0xc] = '\0';
  auVar8[0xd] = '\x01';
  auVar8[0xe] = '\0';
  auVar8[0xf] = '\x01';
  auVar8[0] = '\0';
  auVar8[1] = '\x01';
  auVar8[2] = '\0';
  auVar8[3] = '\x01';
  auVar8[4] = '\0';
  auVar8[5] = '\x01';
  auVar8[6] = '\0';
  auVar8[7] = '\x01';
  alVar10 = (__m128i)pshufb(auVar9,auVar8);
  *coeff = alVar10;
  auVar7._8_8_ = 0;
  auVar7[0] = aiVar1[0];
  auVar7[1] = aiVar1[1];
  auVar7[2] = aiVar1[2];
  auVar7[3] = aiVar1[3];
  auVar7[4] = aiVar1[4];
  auVar7[5] = aiVar1[5];
  auVar7[6] = aiVar1[6];
  auVar7[7] = aiVar1[7];
  auVar6[8] = '\x02';
  auVar6[9] = '\x03';
  auVar6[10] = '\x02';
  auVar6[0xb] = '\x03';
  auVar6[0xc] = '\x02';
  auVar6[0xd] = '\x03';
  auVar6[0xe] = '\x02';
  auVar6[0xf] = '\x03';
  auVar6[0] = '\x02';
  auVar6[1] = '\x03';
  auVar6[2] = '\x02';
  auVar6[3] = '\x03';
  auVar6[4] = '\x02';
  auVar6[5] = '\x03';
  auVar6[6] = '\x02';
  auVar6[7] = '\x03';
  alVar10 = (__m128i)pshufb(auVar7,auVar6);
  coeff[1] = alVar10;
  auVar5._8_8_ = 0;
  auVar5[0] = aiVar1[0];
  auVar5[1] = aiVar1[1];
  auVar5[2] = aiVar1[2];
  auVar5[3] = aiVar1[3];
  auVar5[4] = aiVar1[4];
  auVar5[5] = aiVar1[5];
  auVar5[6] = aiVar1[6];
  auVar5[7] = aiVar1[7];
  auVar4[8] = '\x04';
  auVar4[9] = '\x05';
  auVar4[10] = '\x04';
  auVar4[0xb] = '\x05';
  auVar4[0xc] = '\x04';
  auVar4[0xd] = '\x05';
  auVar4[0xe] = '\x04';
  auVar4[0xf] = '\x05';
  auVar4[0] = '\x04';
  auVar4[1] = '\x05';
  auVar4[2] = '\x04';
  auVar4[3] = '\x05';
  auVar4[4] = '\x04';
  auVar4[5] = '\x05';
  auVar4[6] = '\x04';
  auVar4[7] = '\x05';
  alVar10 = (__m128i)pshufb(auVar5,auVar4);
  coeff[2] = alVar10;
  auVar3._8_8_ = 0;
  auVar3[0] = aiVar1[0];
  auVar3[1] = aiVar1[1];
  auVar3[2] = aiVar1[2];
  auVar3[3] = aiVar1[3];
  auVar3[4] = aiVar1[4];
  auVar3[5] = aiVar1[5];
  auVar3[6] = aiVar1[6];
  auVar3[7] = aiVar1[7];
  auVar2[8] = '\x06';
  auVar2[9] = '\a';
  auVar2[10] = '\x06';
  auVar2[0xb] = '\a';
  auVar2[0xc] = '\x06';
  auVar2[0xd] = '\a';
  auVar2[0xe] = '\x06';
  auVar2[0xf] = '\a';
  auVar2[0] = '\x06';
  auVar2[1] = '\a';
  auVar2[2] = '\x06';
  auVar2[3] = '\a';
  auVar2[4] = '\x06';
  auVar2[5] = '\a';
  auVar2[6] = '\x06';
  auVar2[7] = '\a';
  alVar10 = (__m128i)pshufb(auVar3,auVar2);
  coeff[3] = alVar10;
  return;
}

Assistant:

static inline void prepare_horizontal_filter_coeff_alpha0(int sx,
                                                          __m128i *coeff) {
  // Filter even-index pixels
  const __m128i tmp_0 =
      _mm_loadl_epi64((__m128i *)&av1_filter_8bit[sx >> WARPEDDIFF_PREC_BITS]);

  // Coeffs 0 2 for pixels 0 2 4 6 1 3 5 7
  coeff[0] =
      _mm_shuffle_epi8(tmp_0, _mm_load_si128((__m128i *)shuffle_alpha0_mask01));
  // Coeffs 4 6 for pixels 0 2 4 6 1 3 5 7
  coeff[1] =
      _mm_shuffle_epi8(tmp_0, _mm_load_si128((__m128i *)shuffle_alpha0_mask23));
  // Coeffs 1 3 for pixels 0 2 4 6 1 3 5 7
  coeff[2] =
      _mm_shuffle_epi8(tmp_0, _mm_load_si128((__m128i *)shuffle_alpha0_mask45));
  // Coeffs 5 7 for pixels 0 2 4 6 1 3 5 7
  coeff[3] =
      _mm_shuffle_epi8(tmp_0, _mm_load_si128((__m128i *)shuffle_alpha0_mask67));
}